

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_set_load_balancer_tc_plistener_attribute(void)

{
  code *pcVar1;
  char *__s;
  SlbSetLoadBalancerTCPListenerAttributeRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_371;
  int ret;
  HttpTestListener *local_350;
  HttpTestListener *listener;
  string local_340;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [55];
  allocator<char> local_2b9;
  string local_2b8 [32];
  SlbSetLoadBalancerTCPListenerAttributeRequestType *local_298;
  Slb *slb;
  undefined1 local_288 [7];
  SlbSetLoadBalancerTCPListenerAttributeResponseType resp;
  SlbSetLoadBalancerTCPListenerAttributeRequestType req;
  
  aliyun::SlbSetLoadBalancerTCPListenerAttributeRequestType::
  SlbSetLoadBalancerTCPListenerAttributeRequestType
            ((SlbSetLoadBalancerTCPListenerAttributeRequestType *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"cn-hangzhou",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"my_appid",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"my_secret",&local_319);
  pSVar2 = (SlbSetLoadBalancerTCPListenerAttributeRequestType *)
           aliyun::Slb::CreateSlbClient(local_2b8,local_2f0,local_318);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  local_298 = pSVar2;
  if (pSVar2 == (SlbSetLoadBalancerTCPListenerAttributeRequestType *)0x0) {
    aliyun::SlbSetLoadBalancerTCPListenerAttributeRequestType::
    ~SlbSetLoadBalancerTCPListenerAttributeRequestType
              ((SlbSetLoadBalancerTCPListenerAttributeRequestType *)local_288);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_298,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_set_load_balancer_tc_plistener_attribute_response;
  local_350 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_371);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_371);
  HttpTestListener::Start(local_350);
  std::__cxx11::string::operator=((string *)local_288,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"LoadBalancerId");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_id.field_2._M_local_buf + 8),"ListenerPort");
  std::__cxx11::string::operator=
            ((string *)(req.listener_port.field_2._M_local_buf + 8),"Bandwidth");
  std::__cxx11::string::operator=((string *)(req.bandwidth.field_2._M_local_buf + 8),"Scheduler");
  std::__cxx11::string::operator=
            ((string *)(req.scheduler.field_2._M_local_buf + 8),"PersistenceTimeout");
  std::__cxx11::string::operator=
            ((string *)(req.persistence_timeout.field_2._M_local_buf + 8),"HealthyThreshold");
  std::__cxx11::string::operator=
            ((string *)(req.healthy_threshold.field_2._M_local_buf + 8),"UnhealthyThreshold");
  std::__cxx11::string::operator=
            ((string *)(req.unhealthy_threshold.field_2._M_local_buf + 8),
             "HealthCheckConnectTimeout");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_connect_timeout.field_2._M_local_buf + 8),
             "HealthCheckConnectPort");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_connect_port.field_2._M_local_buf + 8),
             "HealthCheckInterval");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_interval.field_2._M_local_buf + 8),"HealthCheckDomain");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_domain.field_2._M_local_buf + 8),"HealthCheckURI");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_ur_i.field_2._M_local_buf + 8),"HealthCheckHttpCode");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_http_code.field_2._M_local_buf + 8),"HealthCheckType");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_type.field_2._M_local_buf + 8),"SynProxy");
  std::__cxx11::string::operator=((string *)(req.syn_proxy.field_2._M_local_buf + 8),"MaxConnLimit")
  ;
  std::__cxx11::string::operator=
            ((string *)(req.max_conn_limit.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::SetLoadBalancerTCPListenerAttribute
            (local_298,(SlbSetLoadBalancerTCPListenerAttributeResponseType *)local_288,
             (SlbErrorInfo *)((long)&slb + 7));
  HttpTestListener::WaitComplete(local_350);
  pHVar3 = local_350;
  if (local_350 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_350);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_298;
  if (local_298 != (SlbSetLoadBalancerTCPListenerAttributeRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_298);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_set_load_balancer_tc_plistener_attribute() {
  SlbSetLoadBalancerTCPListenerAttributeRequestType req;
  SlbSetLoadBalancerTCPListenerAttributeResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_set_load_balancer_tc_plistener_attribute_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.load_balancer_id = "LoadBalancerId";
  req.listener_port = "ListenerPort";
  req.bandwidth = "Bandwidth";
  req.scheduler = "Scheduler";
  req.persistence_timeout = "PersistenceTimeout";
  req.healthy_threshold = "HealthyThreshold";
  req.unhealthy_threshold = "UnhealthyThreshold";
  req.health_check_connect_timeout = "HealthCheckConnectTimeout";
  req.health_check_connect_port = "HealthCheckConnectPort";
  req.health_check_interval = "HealthCheckInterval";
  req.health_check_domain = "HealthCheckDomain";
  req.health_check_ur_i = "HealthCheckURI";
  req.health_check_http_code = "HealthCheckHttpCode";
  req.health_check_type = "HealthCheckType";
  req.syn_proxy = "SynProxy";
  req.max_conn_limit = "MaxConnLimit";
  req.owner_account = "OwnerAccount";
  int ret = slb->SetLoadBalancerTCPListenerAttribute(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}